

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_acc_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,size_t nb1,size_t nb2,size_t nb3,
             size_t offset,_Bool inplace)

{
  _Bool _Var1;
  long lVar2;
  ggml_tensor *tensor;
  long lVar3;
  char *pcVar4;
  int line;
  int32_t params [5];
  
  lVar2 = b->ne[1] * b->ne[0] * b->ne[2] * b->ne[3];
  lVar3 = a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3];
  if (lVar2 - lVar3 == 0 || lVar2 < lVar3) {
    _Var1 = ggml_is_contiguous_0(a);
    if (_Var1) {
      if (a->type == GGML_TYPE_F32) {
        if (b->type == GGML_TYPE_F32) {
          if (inplace) {
            tensor = ggml_view_tensor(ctx,a);
          }
          else {
            tensor = ggml_dup_tensor(ctx,a);
          }
          params[0] = (int32_t)nb1;
          params[1] = (int32_t)nb2;
          params[2] = (int32_t)nb3;
          params[3] = (int32_t)offset;
          params[4] = (int32_t)inplace;
          ggml_set_op_params(tensor,params,0x14);
          tensor->op = GGML_OP_ACC;
          tensor->src[0] = a;
          tensor->src[1] = b;
          return tensor;
        }
        pcVar4 = "b->type == GGML_TYPE_F32";
        line = 0x7ac;
      }
      else {
        pcVar4 = "a->type == GGML_TYPE_F32";
        line = 0x7ab;
      }
    }
    else {
      pcVar4 = "ggml_is_contiguous(a)";
      line = 0x7aa;
    }
  }
  else {
    pcVar4 = "ggml_nelements(b) <= ggml_nelements(a)";
    line = 0x7a9;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

static struct ggml_tensor * ggml_acc_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        size_t                nb1,
        size_t                nb2,
        size_t                nb3,
        size_t                offset,
        bool                  inplace) {
    GGML_ASSERT(ggml_nelements(b) <= ggml_nelements(a));
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(a->type == GGML_TYPE_F32);
    GGML_ASSERT(b->type == GGML_TYPE_F32);

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    int32_t params[] = { nb1, nb2, nb3, offset, inplace ? 1 : 0 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_ACC;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}